

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O2

void lqMapOverAllOutsideObjects
               (lqInternalDB *lq,float x,float y,float z,float radius,lqCallBackFunction func,
               void *clientQueryState)

{
  lqClientProxy *plVar1;
  lqClientProxy **pplVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  pplVar2 = &lq->other;
  while (plVar1 = *pplVar2, plVar1 != (lqClientProxy *)0x0) {
    fVar5 = x - plVar1->x;
    fVar4 = y - plVar1->y;
    fVar3 = z - plVar1->z;
    fVar3 = fVar3 * fVar3 + fVar5 * fVar5 + fVar4 * fVar4;
    if (fVar3 < radius * radius) {
      (*func)(plVar1->object,fVar3,clientQueryState);
    }
    pplVar2 = &plVar1->next;
  }
  return;
}

Assistant:

void lqMapOverAllOutsideObjects (lqInternalDB* lq, 
				 float x, float y, float z,
				 float radius,
				 lqCallBackFunction func,
				 void* clientQueryState)
{
    lqClientProxy* co = lq->other;
    float radiusSquared = radius * radius;

    /* traverse the "other" bin's client object list */
    lqTraverseBinClientObjectList (co,
				   radiusSquared,
				   func,
				   clientQueryState);
}